

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O2

string * __thiscall
spirv_cross::extract_string_abi_cxx11_
          (string *__return_storage_ptr__,spirv_cross *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv,uint32_t offset)

{
  CompilerError *this_00;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  uVar3 = (ulong)spirv & 0xffffffff;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  do {
    if ((ulong)(*(long *)(this + 8) - *(long *)this >> 2) <= uVar3) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"String was not terminated before EOF");
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar1 = *(uint *)(*(long *)this + uVar3 * 4);
    iVar2 = 4;
    while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
      if ((char)uVar1 == '\0') {
        return __return_storage_ptr__;
      }
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar1 = uVar1 >> 8;
    }
    uVar3 = (ulong)((int)uVar3 + 1);
  } while( true );
}

Assistant:

static string extract_string(const vector<uint32_t> &spirv, uint32_t offset)
{
	string ret;
	for (uint32_t i = offset; i < spirv.size(); i++)
	{
		uint32_t w = spirv[i];

		for (uint32_t j = 0; j < 4; j++, w >>= 8)
		{
			char c = w & 0xff;
			if (c == '\0')
				return ret;
			ret += c;
		}
	}

	SPIRV_CROSS_THROW("String was not terminated before EOF");
}